

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_l2_norm(ggml_compute_params *params,ggml_tensor *dst)

{
  float __y;
  float fVar1;
  int iVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  undefined8 uVar20;
  long lVar21;
  long lVar22;
  float *y;
  int64_t i01;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 in_register_00001284 [12];
  long local_f0;
  
  pgVar4 = dst->src[0];
  if (pgVar4->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xdf6,"fatal error");
  }
  cVar15 = ggml_are_same_shape(pgVar4);
  if (cVar15 == '\0') {
    pcVar18 = "ggml_are_same_shape(src0, dst)";
    uVar20 = 0xdc4;
  }
  else if (pgVar4->nb[0] == 4) {
    __y = (float)dst->op_params[0];
    if (0.0 <= __y) {
      sVar5 = dst->nb[1];
      sVar6 = pgVar4->nb[3];
      uVar7 = pgVar4->ne[0];
      sVar8 = pgVar4->nb[1];
      iVar2 = params->nth;
      iVar3 = params->ith;
      lVar9 = pgVar4->ne[1];
      sVar10 = pgVar4->nb[2];
      sVar11 = dst->nb[3];
      sVar12 = dst->nb[2];
      uVar13 = pgVar4->ne[3];
      local_f0 = sVar8 * (long)iVar3;
      uVar14 = pgVar4->ne[2];
      for (uVar17 = 0; uVar17 != (~((long)uVar13 >> 0x3f) & uVar13); uVar17 = uVar17 + 1) {
        lVar22 = local_f0;
        for (uVar19 = 0; uVar19 != (~((long)uVar14 >> 0x3f) & uVar14); uVar19 = uVar19 + 1) {
          lVar21 = lVar22;
          for (lVar23 = (long)iVar3; lVar23 < lVar9; lVar23 = lVar23 + iVar2) {
            fVar24 = 0.0;
            for (uVar16 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar16; uVar16 = uVar16 + 1) {
              fVar1 = *(float *)((long)pgVar4->data + uVar16 * 4 + lVar21);
              fVar24 = fVar24 + fVar1 * fVar1;
            }
            y = (float *)((long)dst->data + uVar19 * sVar12 + uVar17 * sVar11 + lVar23 * sVar5);
            memcpy(y,(void *)(lVar23 * sVar8 + uVar19 * sVar10 + uVar17 * sVar6 + (long)pgVar4->data
                             ),uVar7 * 4);
            auVar25._4_12_ = in_register_00001284;
            auVar25._0_4_ = fVar24;
            if (fVar24 < 0.0) {
              fVar24 = sqrtf(fVar24);
            }
            else {
              auVar25 = vsqrtss_avx(auVar25,auVar25);
              fVar24 = auVar25._0_4_;
            }
            fVar24 = fmaxf(fVar24,__y);
            ggml_vec_scale_f32((int)uVar7,y,1.0 / fVar24);
            lVar21 = lVar21 + sVar8 * (long)iVar2;
          }
          lVar22 = lVar22 + sVar10;
        }
        local_f0 = local_f0 + sVar6;
      }
      return;
    }
    pcVar18 = "eps >= 0.0f";
    uVar20 = 0xdd0;
  }
  else {
    pcVar18 = "src0->nb[0] == sizeof(float)";
    uVar20 = 0xdc6;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar20,"GGML_ASSERT(%s) failed",pcVar18);
}

Assistant:

void ggml_compute_forward_l2_norm(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_l2_norm_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}